

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O2

void __thiscall
ExportEmitString_SimpleString_Test::ExportEmitString_SimpleString_Test
          (ExportEmitString_SimpleString_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00228158;
  return;
}

Assistant:

TEST (ExportEmitString, SimpleString) {
    using namespace std::string_literals;
    {
        pstore::exchange::export_ns::ostringstream os1;
        auto const empty = ""s;
        pstore::exchange::export_ns::emit_string (os1, std::begin (empty), std::end (empty));
        EXPECT_EQ (os1.str (), R"("")");
    }
    {
        pstore::exchange::export_ns::ostringstream os2;
        auto const hello = "hello"s;
        pstore::exchange::export_ns::emit_string (os2, std::begin (hello), std::end (hello));
        EXPECT_EQ (os2.str (), R"("hello")");
    }
}